

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

int mraa_pwm_lookup(char *pwm_name)

{
  char *__s2;
  int iVar1;
  size_t sVar2;
  int local_1c;
  int i;
  char *pwm_name_local;
  
  if (((plat != (mraa_board_t *)0x0) && (pwm_name != (char *)0x0)) &&
     (sVar2 = strlen(pwm_name), sVar2 != 0)) {
    local_1c = 0;
    do {
      if (plat->pwm_dev_count <= local_1c) {
        return -1;
      }
      if (plat->pwm_dev[local_1c].name != (char *)0x0) {
        __s2 = plat->pwm_dev[local_1c].name;
        sVar2 = strlen(plat->pwm_dev[local_1c].name);
        iVar1 = strncmp(pwm_name,__s2,sVar2 + 1);
        if (iVar1 == 0) {
          return plat->pwm_dev[local_1c].index;
        }
      }
      local_1c = local_1c + 1;
    } while( true );
  }
  return -1;
}

Assistant:

int
mraa_pwm_lookup(const char* pwm_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (pwm_name == NULL || strlen(pwm_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->pwm_dev_count; i++) {
        if (plat->pwm_dev[i].name != NULL &&
            strncmp(pwm_name, plat->pwm_dev[i].name, strlen(plat->pwm_dev[i].name) + 1) == 0) {
            return plat->pwm_dev[i].index;
        }
    }
    return -1;
}